

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

vector<docopt::Option,_std::allocator<docopt::Option>_> *
parse_defaults(vector<docopt::Option,_std::allocator<docopt::Option>_> *__return_storage_ptr__,
              string *doc)

{
  string *psVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  pointer pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  pointer pbVar7;
  string *option_description;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_1c8;
  undefined1 local_140 [8];
  sregex_token_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  pointer local_88;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  
  s.field_2._8_8_ = __return_storage_ptr__;
  if ((parse_defaults(std::__cxx11::string_const&)::re_delimiter_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse_defaults(std::__cxx11::string_const&)::
                                   re_delimiter_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_defaults(std::__cxx11::string_const&)::re_delimiter_abi_cxx11_,
               "(?:^|\\n)[ \\t]*(?=-{1,2})",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_defaults(std::__cxx11::string_const&)::re_delimiter_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&parse_defaults(std::__cxx11::string_const&)::re_delimiter_abi_cxx11_);
    __return_storage_ptr__ =
         (vector<docopt::Option,_std::allocator<docopt::Option>_> *)s.field_2._8_8_;
  }
  (__return_storage_ptr__->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = (undefined1  [8])&it._M_position._M_end;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"options:","");
  parse_section(&local_a8,(string *)local_140,doc);
  if (local_140 != (undefined1  [8])&it._M_position._M_end) {
    operator_delete((void *)local_140);
  }
  local_80 = local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_90 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&PTR_flat_00150f78;
    pbVar7 = local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_58._M_current = (char *)&s._M_string_length;
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar6,pcVar6 + pbVar7->_M_string_length);
      _Var2._M_current = local_58._M_current;
      lVar5 = std::__cxx11::string::find((char)(string *)&local_58,0x3a);
      pcVar6 = (pointer)((long)_Var2._M_current - (long)local_58._M_current);
      if (s._M_dataplus._M_p + (long)local_58._M_current ==
          (pointer)((long)_Var2._M_current + lVar5 + 1)) {
        *(char *)((long)local_58._M_current + (long)pcVar6) = '\0';
        s._M_dataplus._M_p = pcVar6;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_58,(ulong)pcVar6);
      }
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88 = pbVar7;
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::regex_token_iterator
                ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_140,local_58,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(s._M_dataplus._M_p + local_58._M_current),
                 &parse_defaults(std::__cxx11::string_const&)::re_delimiter_abi_cxx11_,-1,0);
      while( true ) {
        local_1c8._M_suffix.
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .second._M_current._0_1_ = 0;
        local_1c8._M_suffix._9_8_ = 0;
        local_1c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1c8._M_suffix.
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .first._M_current._0_1_ = 0;
        local_1c8._M_suffix.
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .first._M_current._1_7_ = 0;
        local_1c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1c8._M_position._M_match._M_begin._M_current = (char *)0x0;
        local_1c8._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8._M_position._M_pregex = (regex_type *)0x0;
        local_1c8._M_position._M_flags = 0;
        local_1c8._M_position._28_4_ = 0;
        local_1c8._M_position._M_begin._M_current = (char *)0x0;
        local_1c8._M_position._M_end._M_current = (char *)0x0;
        local_1c8._M_n = 0;
        local_1c8._M_result = (value_type *)0x0;
        local_1c8._M_has_m1 = false;
        bVar3 = std::__cxx11::
                regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                ::operator==((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                              *)local_140,&local_1c8);
        if (local_1c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1c8._M_position._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8._M_position._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar3) break;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)it._M_n);
        std::__cxx11::
        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
        ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                      *)local_140);
      }
      if (it._M_position._M_match._M_begin._M_current != (char *)0x0) {
        operator_delete(it._M_position._M_match._M_begin._M_current);
      }
      option_description =
           local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (it._M_position._24_8_ != 0) {
        operator_delete((void *)it._M_position._24_8_);
        option_description =
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; option_description != psVar1; option_description = option_description + 1) {
        local_140 = (undefined1  [8])&it._M_position._M_end;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"-","");
        if ((char *)option_description->_M_string_length < it._M_position._M_begin._M_current) {
          bVar3 = false;
        }
        else if (it._M_position._M_begin._M_current == (char *)0x0) {
          bVar3 = true;
        }
        else {
          iVar4 = bcmp((void *)local_140,(option_description->_M_dataplus)._M_p,
                       (size_t)it._M_position._M_begin._M_current);
          bVar3 = iVar4 == 0;
        }
        if (local_140 != (undefined1  [8])&it._M_position._M_end) {
          operator_delete((void *)local_140);
        }
        if (bVar3) {
          docopt::Option::parse((Option *)local_140,option_description);
          std::vector<docopt::Option,_std::allocator<docopt::Option>_>::emplace_back<docopt::Option>
                    ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)s.field_2._8_8_,
                     (Option *)local_140);
          if ((value_type **)it._M_suffix._16_8_ != &it._M_result) {
            operator_delete((void *)it._M_suffix._16_8_);
          }
          if ((value_type *)
              it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != &it._M_suffix) {
            operator_delete(it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish);
          }
          local_140 = (undefined1  [8])local_90;
          if ((int)it._M_position._M_match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&it._M_position._M_match.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data + 8));
          }
          else if (((int)it._M_position._M_match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start == 3) &&
                  (it._M_position._M_match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   (pointer)&it._M_position._M_match._M_begin)) {
            operator_delete(it._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
          }
          if ((regex_type **)it._M_position._M_begin._M_current != &it._M_position._M_pregex) {
            operator_delete(it._M_position._M_begin._M_current);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if ((size_type *)local_58._M_current != &s._M_string_length) {
        operator_delete(local_58._M_current);
      }
      pbVar7 = local_88 + 1;
    } while (pbVar7 != local_80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return (vector<docopt::Option,_std::allocator<docopt::Option>_> *)s.field_2._8_8_;
}

Assistant:

std::vector<Option> parse_defaults(std::string const& doc) {
	// This pattern is a delimiter by which we split the options.
	// The delimiter is a new line followed by a whitespace(s) followed by one or two hyphens.
	static std::regex const re_delimiter{
		"(?:^|\\n)[ \\t]*"  // a new line with leading whitespace
		"(?=-{1,2})"        // [split happens here] (positive lookahead) ... and followed by one or two hyphes
	};

	std::vector<Option> defaults;
	for (auto s : parse_section("options:", doc)) {
		s.erase(s.begin(), s.begin() + static_cast<std::ptrdiff_t>(s.find(':')) + 1); // get rid of "options:"

		for (const auto& opt : regex_split(s, re_delimiter)) {
			if (starts_with(opt, "-")) {
				defaults.emplace_back(Option::parse(opt));
			}
		}
	}

	return defaults;
}